

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O1

void __thiscall QHttpThreadDelegate::headerChangedSlot(QHttpThreadDelegate *this)

{
  Data *dd;
  Data *pDVar1;
  QArrayData *pQVar2;
  QHttpNetworkReply *pQVar3;
  qsizetype qVar4;
  bool bVar5;
  QHttpThreadDelegate QVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  char *b;
  undefined4 *puVar10;
  undefined8 uVar11;
  qint64 qVar12;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff98;
  undefined8 local_60;
  Data *local_58;
  QHttpNetworkReply local_50 [8];
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x150) != 0) {
    if (this[0x10] == (QHttpThreadDelegate)0x1) {
      QHttpNetworkReply::sslConfiguration(local_50);
      local_48.d.d = (Data *)0x0;
      local_48.d.ptr = (char16_t *)local_50;
      QMetaObject::activate((QObject *)this,&staticMetaObject,4,(void **)&local_48);
      QSslConfiguration::~QSslConfiguration((QSslConfiguration *)local_50);
    }
    bVar5 = QHttpNetworkReply::supportsUserProvidedDownloadBuffer
                      (*(QHttpNetworkReply **)(this + 0x150));
    if ((bVar5) && (0 < *(long *)(this + 0x30))) {
      lVar8 = (**(code **)(**(long **)(this + 0x150) + 0x80))();
      if (lVar8 <= *(long *)(this + 0x30)) {
        uVar9 = (**(code **)(**(long **)(this + 0x150) + 0x80))();
        b = (char *)operator_new__(uVar9,(nothrow_t *)&std::nothrow);
        if (b != (char *)0x0) {
          puVar10 = (undefined4 *)operator_new(0x20);
          *(char **)(puVar10 + 6) = b;
          *(code **)(puVar10 + 2) =
               QtSharedPointer::
               ExternalRefCountWithCustomDeleter<char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qhttpthreaddelegate.cpp:613:56)>
               ::deleter;
          puVar10[1] = 1;
          *puVar10 = 1;
          dd = *(Data **)(this + 0x128);
          *(undefined4 **)(this + 0x128) = puVar10;
          *(char **)(this + 0x120) = b;
          QSharedPointer<char>::deref(dd);
          QSharedPointer<char>::deref((Data *)0x0);
          QHttpNetworkReply::setUserProvidedDownloadBuffer(*(QHttpNetworkReply **)(this + 0x150),b);
        }
      }
    }
    (**(code **)(**(long **)(this + 0x150) + 0x90))(&local_48);
    pDVar1 = *(Data **)(this + 0xb0);
    *(Data **)(this + 0xb0) = local_48.d.d;
    local_48.d.d = pDVar1;
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_48);
    iVar7 = QHttpNetworkReply::statusCode(*(QHttpNetworkReply **)(this + 0x150));
    *(int *)(this + 0xb8) = iVar7;
    QHttpNetworkReply::reasonPhrase(&local_48,*(QHttpNetworkReply **)(this + 0x150));
    pQVar2 = *(QArrayData **)(this + 0xc0);
    pQVar3 = *(QHttpNetworkReply **)(this + 200);
    *(Data **)(this + 0xc0) = local_48.d.d;
    *(char16_t **)(this + 200) = local_48.d.ptr;
    qVar4 = *(qsizetype *)(this + 0xd0);
    *(qsizetype *)(this + 0xd0) = local_48.d.size;
    local_48.d.d = (Data *)pQVar2;
    local_48.d.ptr = (char16_t *)pQVar3;
    local_48.d.size = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    QVar6 = (QHttpThreadDelegate)
            QHttpNetworkReply::isPipeliningUsed(*(QHttpNetworkReply **)(this + 0x150));
    this[0xd8] = QVar6;
    uVar11 = (**(code **)(**(long **)(this + 0x150) + 0x80))();
    *(undefined8 *)(this + 0xe0) = uVar11;
    qVar12 = QHttpNetworkReply::removedContentLength(*(QHttpNetworkReply **)(this + 0x150));
    *(qint64 *)(this + 0xe8) = qVar12;
    QVar6 = (QHttpThreadDelegate)
            QHttpNetworkReply::isHttp2Used(*(QHttpNetworkReply **)(this + 0x150));
    this[0xd9] = QVar6;
    QVar6 = (QHttpThreadDelegate)
            QHttpNetworkReply::isCompressed(*(QHttpNetworkReply **)(this + 0x150));
    this[0xda] = QVar6;
    iVar7 = *(int *)(this + 0xb8);
    QVar6 = this[0xd8];
    local_60 = *(undefined8 *)(this + 0x120);
    local_58 = *(Data **)(this + 0x128);
    if (local_58 != (Data *)0x0) {
      LOCK();
      (local_58->weakref)._q_value.super___atomic_base<int>._M_i =
           (local_58->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (local_58->strongref)._q_value.super___atomic_base<int>._M_i =
           (local_58->strongref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    downloadMetaData(this,(QHttpHeaders *)(this + 0xb0),iVar7,(QString *)(this + 0xc0),(bool)QVar6,
                     *(QSharedPointer<char> *)(this + 0xe0),(qint64)&local_60,
                     CONCAT44(in_stack_ffffffffffffff8c,(uint)(byte)this[0xd9]),(bool)this[0xda],
                     (bool)in_stack_ffffffffffffff98);
    QSharedPointer<char>::deref(local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::headerChangedSlot()
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::headerChangedSlot() thread=" << QThread::currentThreadId();
#endif

#ifndef QT_NO_SSL
    if (ssl)
        emit sslConfigurationChanged(httpReply->sslConfiguration());
#endif

    // Is using a zerocopy buffer allowed by user and possible with this reply?
    if (httpReply->supportsUserProvidedDownloadBuffer()
        && (downloadBufferMaximumSize > 0) && (httpReply->contentLength() <= downloadBufferMaximumSize)) {
        char *buf = new (std::nothrow) char[httpReply->contentLength()];
        // in out of memory situations, don't use downloadBuffer.
        if (buf) {
            downloadBuffer = QSharedPointer<char>(buf, [](auto p) { delete[] p; });
            httpReply->setUserProvidedDownloadBuffer(buf);
        }
    }

    // We fetch this into our own
    incomingHeaders = httpReply->header();
    incomingStatusCode = httpReply->statusCode();
    incomingReasonPhrase = httpReply->reasonPhrase();
    isPipeliningUsed = httpReply->isPipeliningUsed();
    incomingContentLength = httpReply->contentLength();
    removedContentLength = httpReply->removedContentLength();
    isHttp2Used = httpReply->isHttp2Used();
    isCompressed = httpReply->isCompressed();

    emit downloadMetaData(incomingHeaders,
                          incomingStatusCode,
                          incomingReasonPhrase,
                          isPipeliningUsed,
                          downloadBuffer,
                          incomingContentLength,
                          removedContentLength,
                          isHttp2Used,
                          isCompressed);
}